

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O0

uint __thiscall
QFragmentMapData<QTextFragmentData>::createFragment(QFragmentMapData<QTextFragmentData> *this)

{
  uint index;
  long lVar1;
  Header *pHVar2;
  QTextFragmentData *pQVar3;
  anon_union_8_2_e778645c_for_QFragmentMapData<QTextFragmentData>_1 *in_RDI;
  long in_FS_OFFSET;
  undefined1 auVar4 [12];
  uint nextPos;
  QTextFragmentData *newFragments;
  uint freePos;
  CalculateGrowingBlockSizeResult blockInfo;
  uint local_34;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  index = *(uint *)((long)in_RDI->head + 8);
  if (index == in_RDI->head->allocated) {
    auVar4 = qCalculateGrowingBlockSize((ulong)(index + 1),0x20,0);
    pHVar2 = (Header *)realloc(in_RDI->head,auVar4._0_8_);
    qt_noop();
    in_RDI->head = pHVar2;
    in_RDI->head->allocated = auVar4._8_4_;
    pQVar3 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,index);
    (pQVar3->super_QFragment<1>).right = 0;
  }
  pQVar3 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,index);
  local_34 = (pQVar3->super_QFragment<1>).right;
  if ((local_34 == 0) && (local_34 = index + 1, local_34 < in_RDI->head->allocated)) {
    pQVar3 = F((QFragmentMapData<QTextFragmentData> *)in_RDI,local_34);
    (pQVar3->super_QFragment<1>).right = 0;
  }
  in_RDI->head->freelist = local_34;
  in_RDI->head->node_count = in_RDI->head->node_count + 1;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return index;
}

Assistant:

uint QFragmentMapData<Fragment>::createFragment()
{
    Q_ASSERT(head->freelist <= head->allocated);

    uint freePos = head->freelist;
    if (freePos == head->allocated) {
        // need to create some free space
        auto blockInfo = qCalculateGrowingBlockSize(freePos + 1, fragmentSize);
        Fragment *newFragments = (Fragment *)realloc(fragments, blockInfo.size);
        Q_CHECK_PTR(newFragments);
        fragments = newFragments;
        head->allocated = quint32(blockInfo.elementCount);
        F(freePos).right = 0;
    }

    uint nextPos = F(freePos).right;
    if (!nextPos) {
        nextPos = freePos+1;
        if (nextPos < head->allocated)
            F(nextPos).right = 0;
    }

    head->freelist = nextPos;

    ++head->node_count;

    return freePos;
}